

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_exit(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  long *plVar2;
  undefined8 *puVar3;
  Value resultCode;
  long *local_48;
  char local_40;
  undefined1 local_38 [32];
  
  exitASAP = true;
  local_40 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001d10b0;
  plVar2[3] = 0xb;
  plVar2[4] = -1;
  puVar3 = (undefined8 *)operator_new__(0xb);
  plVar2[2] = (long)puVar3;
  *puVar3 = 0x6f43746c75736572;
  *(undefined4 *)((long)puVar3 + 7) = 0x65646f;
  local_48 = plVar2;
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (long *)0x0) && (local_40 == '\0')) {
    plVar2 = local_48 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  if (local_38[0] != Null) {
    exitResult = MiniScript::Value::IntValue((Value *)local_38);
  }
  MiniScript::Machine::Stop((Machine *)partialResult.rs[2].result.data.ref);
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  pLVar1 = MiniScript::IntrinsicResult::Null;
  (context->code).ls = MiniScript::IntrinsicResult::Null;
  if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar2 = &(pLVar1->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + 1;
  }
  if ((Temp < local_38[0]) && ((RefCountedStorage *)local_38._8_8_ != (RefCountedStorage *)0x0)) {
    plVar2 = (long *)(local_38._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(*(_func_int ***)local_38._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exit(Context *context, IntrinsicResult partialResult) {
	exitASAP = true;
	Value resultCode = context->GetVar("resultCode");
	if (!resultCode.IsNull()) exitResult = (int)resultCode.IntValue();
	context->vm->Stop();
	return IntrinsicResult::Null;
}